

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = this->w;
  iVar1 = this->h;
  iVar2 = this->c;
  iVar6 = iVar1 * iVar7 * iVar2;
  if (iVar6 == _h * _w) {
    iVar3 = this->dims;
    sVar4 = this->cstep;
    if ((iVar3 == 3) && (sVar4 != (long)iVar1 * (long)iVar7)) {
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      create(__return_storage_ptr__,_w,_h,this->elemsize,this->elempack,_allocator);
      if (0 < this->c) {
        lVar8 = 0;
        do {
          sVar4 = this->elemsize;
          iVar7 = this->h * this->w;
          memcpy((void *)((long)((int)lVar8 * iVar7) * sVar4 + (long)__return_storage_ptr__->data),
                 (void *)(this->cstep * lVar8 * sVar4 + (long)this->data),(long)iVar7 * sVar4);
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->c);
      }
    }
    else {
      __return_storage_ptr__->data = this->data;
      piVar5 = this->refcount;
      __return_storage_ptr__->refcount = piVar5;
      __return_storage_ptr__->elemsize = this->elemsize;
      __return_storage_ptr__->elempack = this->elempack;
      __return_storage_ptr__->allocator = this->allocator;
      __return_storage_ptr__->dims = iVar3;
      __return_storage_ptr__->w = iVar7;
      __return_storage_ptr__->h = iVar1;
      __return_storage_ptr__->c = iVar2;
      __return_storage_ptr__->cstep = sVar4;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = _h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)iVar6;
    }
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, Allocator* _allocator) const
{
    if (w * h * c != _w * _h)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, _h, elemsize, elempack, _allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.c = 1;

    m.cstep = _w * _h;

    return m;
}